

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98c_write.c
# Opt level: O0

int write_s98v3(s98c *ctx,FILE *fp)

{
  int iVar1;
  s98deviceinfo *psVar2;
  uint32_t local_44;
  s98deviceinfo *info;
  int i;
  int tag_offset;
  int dump_length;
  int loop_offset;
  int dump_offset;
  int devices_size;
  int header_size;
  FILE *fp_local;
  s98c *ctx_local;
  
  dump_length = (ctx->header).device_count * 0x10 + 0x20;
  tag_offset = 0;
  iVar1 = (int)ctx->p - (int)ctx->dump_buffer;
  if (ctx->tags_count == 0) {
    local_44 = 0;
  }
  else {
    local_44 = dump_length + iVar1;
  }
  if (ctx->loop_start != (uint8_t *)0x0) {
    tag_offset = dump_length + ((int)ctx->loop_start - (int)ctx->dump_buffer);
  }
  if (ctx->dump_start != (uint8_t *)0x0) {
    dump_length = dump_length + ((int)ctx->dump_start - (int)ctx->dump_buffer);
  }
  (ctx->header).offset_to_tag = local_44;
  (ctx->header).offset_to_dump = dump_length;
  (ctx->header).offset_to_loop = tag_offset;
  fwrite("S98",1,3,(FILE *)fp);
  fputc((ctx->header).version + 0x30,(FILE *)fp);
  write_dword(fp,(ctx->header).timer_numerator);
  write_dword(fp,(ctx->header).timer_denominator);
  write_dword(fp,0);
  write_dword(fp,(ctx->header).offset_to_tag);
  write_dword(fp,(ctx->header).offset_to_dump);
  write_dword(fp,(ctx->header).offset_to_loop);
  write_dword(fp,(ctx->header).device_count);
  for (info._4_4_ = 0; info._4_4_ < (ctx->header).device_count; info._4_4_ = info._4_4_ + 1) {
    psVar2 = ctx->devices + (int)info._4_4_;
    write_dword(fp,psVar2->device);
    write_dword(fp,psVar2->clock);
    write_dword(fp,psVar2->panpot);
    write_dword(fp,psVar2->reserved);
  }
  fwrite(ctx->dump_buffer,1,(long)iVar1,(FILE *)fp);
  write_s98v3_tags(ctx,fp);
  return 0;
}

Assistant:

int write_s98v3(struct s98c* ctx, FILE* fp)
{
    int header_size = 0x20; 
    int devices_size = sizeof(struct s98deviceinfo) * ctx->header.device_count;
    int dump_offset = header_size + devices_size;
    int loop_offset = 0;
    int dump_length = ctx->p - ctx->dump_buffer;
    int tag_offset = (ctx->tags_count == 0) ? 0 : dump_offset + dump_length;

    if(ctx->loop_start != NULL) {
        loop_offset = dump_offset + (ctx->loop_start - ctx->dump_buffer);
    }
    if(ctx->dump_start != NULL) {
        dump_offset += (ctx->dump_start - ctx->dump_buffer);
    }
    ctx->header.offset_to_tag = tag_offset;
    ctx->header.offset_to_dump = dump_offset;
    ctx->header.offset_to_loop = loop_offset;

    fwrite("S98", 1, 3, fp); // 0
    fputc('0' + ctx->header.version, fp); // 3
    write_dword(fp, ctx->header.timer_numerator); // 4
    write_dword(fp, ctx->header.timer_denominator); // 8
    write_dword(fp, 0); // c
    write_dword(fp, ctx->header.offset_to_tag); // 10 
    write_dword(fp, ctx->header.offset_to_dump); //14
    write_dword(fp, ctx->header.offset_to_loop); //18
    write_dword(fp, ctx->header.device_count);

    int i;
    for(i = 0; i < ctx->header.device_count; i++) {
        struct s98deviceinfo* info = ctx->devices + i;

        write_dword(fp, info->device);
        write_dword(fp, info->clock);
        write_dword(fp, info->panpot);
        write_dword(fp, info->reserved);
    }
    
    fwrite(ctx->dump_buffer, 1, dump_length, fp);
    write_s98v3_tags(ctx, fp);

    return 0;
}